

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O1

void Js::ByteCodeDumper::
     DumpBrReg1Unsigned1<Js::OpLayoutT_BrReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
               (OpCode op,OpLayoutT_BrReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  short sVar1;
  uint uVar2;
  
  sVar1 = data->RelativeJumpOffset;
  uVar2 = ByteCodeReader::GetCurrentOffset(reader);
  Output::Print(L" x:%04x (%4d) ",(ulong)(uVar2 + (int)sVar1),(ulong)(uint)(int)sVar1);
  Output::Print(L" R%d ",(ulong)data->R1);
  Output::Print(L" uint:%u ",(ulong)data->C2);
  return;
}

Assistant:

void ByteCodeDumper::DumpBrReg1Unsigned1(OpCode op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        DumpOffset(data->RelativeJumpOffset, reader);
        DumpReg(data->R1);
        DumpU4(data->C2);
    }